

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::operator>>=(BN *this,size_t shift)

{
  ushort uVar1;
  value_type vVar2;
  char cVar3;
  ulong t;
  size_type sVar4;
  reference pvVar5;
  byte bVar6;
  ulong local_50;
  size_t i;
  long local_30;
  size_t realshift;
  size_t baseshift;
  size_t shift_local;
  BN *this_local;
  
  this_local = this;
  if (shift != 0) {
    t = shift >> 4;
    local_30 = shift + t * -0x10;
    realshift = t;
    baseshift = shift;
    shift_local = (size_t)this;
    if (local_30 == 0) {
      divbt((BN *)&i,this,t);
      this_local = operator=(this,(BN *)&i);
      ~BN((BN *)&i);
    }
    else {
      sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
      if (t < sVar4) {
        for (local_50 = 0;
            sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba),
            local_50 < (sVar4 - realshift) - 1; local_50 = local_50 + 1) {
          pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             (&this->ba,local_50 + realshift);
          uVar1 = *pvVar5;
          bVar6 = (byte)local_30;
          pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             (&this->ba,local_50 + realshift + 1);
          vVar2 = *pvVar5;
          cVar3 = (char)local_30;
          pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             (&this->ba,local_50);
          *pvVar5 = (ushort)((int)(uint)uVar1 >> (bVar6 & 0x1f)) | vVar2 << (0x10U - cVar3 & 0x1f);
        }
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::back(&this->ba);
        uVar1 = *pvVar5;
        bVar6 = (byte)local_30;
        sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&this->ba,(sVar4 - realshift) - 1);
        *pvVar5 = (value_type)((int)(uint)uVar1 >> (bVar6 & 0x1f));
        sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  (&this->ba,sVar4 - realshift);
        anon_unknown.dwarf_977c::Norm(&this->ba);
      }
      else {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,0);
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&this->ba,0);
        *pvVar5 = 0;
      }
    }
  }
  return this_local;
}

Assistant:

BN& BN::operator >>= (size_t shift) {
    if (shift == 0)
        return *this;
    size_t baseshift = shift / bz8;
    size_t realshift = shift - baseshift * bz8;

    if (realshift == 0)
        return *this = divbt(baseshift);

    if (baseshift >= ba.size()) {
        ba.resize(0);
        ba[0] = 0;
        return *this;
    }

    for (size_t i = 0; i < ba.size() - baseshift - 1; ++i) {
        ba[i] =
            (ba[i + baseshift] >> realshift) |
            (ba[i + baseshift + 1] << (bz8 - realshift));
    }
    ba[ba.size() - baseshift - 1] = ba.back() >> realshift;
    ba.resize(ba.size() - baseshift);

    Norm(ba);
    return *this;
}